

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

void __thiscall despot::Solver::~Solver(Solver *this)

{
  this->_vptr_Solver = (_func_int **)&PTR__Solver_0019b550;
  History::~History(&this->history_);
  return;
}

Assistant:

Solver::~Solver() {
}